

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_hash_set_test.cc
# Opt level: O1

void __thiscall
phmap::priv::anon_unknown_5::ParallelFlatHashSet_ForEach_Test::TestBody
          (ParallelFlatHashSet_ForEach_Test *this)

{
  char cVar1;
  long lVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [11];
  undefined1 auVar12 [11];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [13];
  undefined1 auVar16 [13];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  int iVar19;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  int *piVar23;
  pointer *__ptr;
  char *message;
  char *pcVar24;
  char *pcVar25;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  initializer_list<phmap::priv::(anonymous_namespace)::Entry> iVar26;
  int counter;
  AssertionResult gtest_ar;
  Set m;
  int in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  AssertHelper local_360;
  int local_354;
  Entry local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_348;
  undefined8 local_340;
  long local_338;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  local_330;
  
  local_350.key = 1;
  local_350.value = 7;
  pbStack_348 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x800000002;
  local_340 = 0xb00000005;
  iVar26._M_len = 3;
  iVar26._M_array = &local_350;
  parallel_flat_hash_set<phmap::priv::(anonymous_namespace)::Entry,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>,_4UL,_phmap::NullMutex>
  ::parallel_hash_set((parallel_flat_hash_set<phmap::priv::(anonymous_namespace)::Entry,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>,_4UL,_phmap::NullMutex>
                       *)&local_330,iVar26,(size_t)&stack0xfffffffffffffc98,(hasher *)&local_360,
                      (key_equal *)&local_354,
                      (allocator_type *)
                      CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  local_354 = 0;
  lVar20 = 0;
  do {
    pcVar24 = *(char **)((long)&local_330.sets_._M_elems[0].set_.ctrl_ + lVar20);
    piVar23 = *(int **)((long)&local_330.sets_._M_elems[0].set_.slots_ + lVar20);
    cVar1 = *pcVar24;
    pcVar25 = pcVar24;
    while (cVar1 < -1) {
      iVar19 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                      CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar8 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                     CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar9 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                     CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar10 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                      CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -(*pcVar25 < (char)iVar19);
      in_XMM1_Bb = -(pcVar25[1] < (char)((uint)iVar19 >> 8));
      in_XMM1_Bc = -(pcVar25[2] < (char)((uint)iVar19 >> 0x10));
      in_XMM1_Bd = -(pcVar25[3] < (char)((uint)iVar19 >> 0x18));
      in_XMM1_Be = -(pcVar25[4] < (char)iVar8);
      in_XMM1_Bf = -(pcVar25[5] < (char)((uint)iVar8 >> 8));
      in_XMM1_Bg = -(pcVar25[6] < (char)((uint)iVar8 >> 0x10));
      in_XMM1_Bh = -(pcVar25[7] < (char)((uint)iVar8 >> 0x18));
      in_XMM1_Bi = -(pcVar25[8] < (char)iVar9);
      in_XMM1_Bj = -(pcVar25[9] < (char)((uint)iVar9 >> 8));
      in_XMM1_Bk = -(pcVar25[10] < (char)((uint)iVar9 >> 0x10));
      in_XMM1_Bl = -(pcVar25[0xb] < (char)((uint)iVar9 >> 0x18));
      in_XMM1_Bm = -(pcVar25[0xc] < (char)iVar10);
      in_XMM1_Bn = -(pcVar25[0xd] < (char)((uint)iVar10 >> 8));
      in_XMM1_Bo = -(pcVar25[0xe] < (char)((uint)iVar10 >> 0x10));
      in_XMM1_Bp = -(pcVar25[0xf] < (char)((uint)iVar10 >> 0x18));
      auVar4[1] = in_XMM1_Bb;
      auVar4[0] = in_XMM1_Ba;
      auVar4[2] = in_XMM1_Bc;
      auVar4[3] = in_XMM1_Bd;
      auVar4[4] = in_XMM1_Be;
      auVar4[5] = in_XMM1_Bf;
      auVar4[6] = in_XMM1_Bg;
      auVar4[7] = in_XMM1_Bh;
      auVar4[8] = in_XMM1_Bi;
      auVar4[9] = in_XMM1_Bj;
      auVar4[10] = in_XMM1_Bk;
      auVar4[0xb] = in_XMM1_Bl;
      auVar4[0xc] = in_XMM1_Bm;
      auVar4[0xd] = in_XMM1_Bn;
      auVar4[0xe] = in_XMM1_Bo;
      auVar4[0xf] = in_XMM1_Bp;
      auVar5[1] = in_XMM1_Bb;
      auVar5[0] = in_XMM1_Ba;
      auVar5[2] = in_XMM1_Bc;
      auVar5[3] = in_XMM1_Bd;
      auVar5[4] = in_XMM1_Be;
      auVar5[5] = in_XMM1_Bf;
      auVar5[6] = in_XMM1_Bg;
      auVar5[7] = in_XMM1_Bh;
      auVar5[8] = in_XMM1_Bi;
      auVar5[9] = in_XMM1_Bj;
      auVar5[10] = in_XMM1_Bk;
      auVar5[0xb] = in_XMM1_Bl;
      auVar5[0xc] = in_XMM1_Bm;
      auVar5[0xd] = in_XMM1_Bn;
      auVar5[0xe] = in_XMM1_Bo;
      auVar5[0xf] = in_XMM1_Bp;
      auVar17[1] = in_XMM1_Bd;
      auVar17[0] = in_XMM1_Bc;
      auVar17[2] = in_XMM1_Be;
      auVar17[3] = in_XMM1_Bf;
      auVar17[4] = in_XMM1_Bg;
      auVar17[5] = in_XMM1_Bh;
      auVar17[6] = in_XMM1_Bi;
      auVar17[7] = in_XMM1_Bj;
      auVar17[8] = in_XMM1_Bk;
      auVar17[9] = in_XMM1_Bl;
      auVar17[10] = in_XMM1_Bm;
      auVar17[0xb] = in_XMM1_Bn;
      auVar17[0xc] = in_XMM1_Bo;
      auVar17[0xd] = in_XMM1_Bp;
      auVar15[1] = in_XMM1_Be;
      auVar15[0] = in_XMM1_Bd;
      auVar15[2] = in_XMM1_Bf;
      auVar15[3] = in_XMM1_Bg;
      auVar15[4] = in_XMM1_Bh;
      auVar15[5] = in_XMM1_Bi;
      auVar15[6] = in_XMM1_Bj;
      auVar15[7] = in_XMM1_Bk;
      auVar15[8] = in_XMM1_Bl;
      auVar15[9] = in_XMM1_Bm;
      auVar15[10] = in_XMM1_Bn;
      auVar15[0xb] = in_XMM1_Bo;
      auVar15[0xc] = in_XMM1_Bp;
      auVar13[1] = in_XMM1_Bf;
      auVar13[0] = in_XMM1_Be;
      auVar13[2] = in_XMM1_Bg;
      auVar13[3] = in_XMM1_Bh;
      auVar13[4] = in_XMM1_Bi;
      auVar13[5] = in_XMM1_Bj;
      auVar13[6] = in_XMM1_Bk;
      auVar13[7] = in_XMM1_Bl;
      auVar13[8] = in_XMM1_Bm;
      auVar13[9] = in_XMM1_Bn;
      auVar13[10] = in_XMM1_Bo;
      auVar13[0xb] = in_XMM1_Bp;
      auVar11[1] = in_XMM1_Bg;
      auVar11[0] = in_XMM1_Bf;
      auVar11[2] = in_XMM1_Bh;
      auVar11[3] = in_XMM1_Bi;
      auVar11[4] = in_XMM1_Bj;
      auVar11[5] = in_XMM1_Bk;
      auVar11[6] = in_XMM1_Bl;
      auVar11[7] = in_XMM1_Bm;
      auVar11[8] = in_XMM1_Bn;
      auVar11[9] = in_XMM1_Bo;
      auVar11[10] = in_XMM1_Bp;
      uVar21 = (ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar17 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar15 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar13 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar11 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                 CONCAT18(in_XMM1_Bo,
                                                          CONCAT17(in_XMM1_Bn,
                                                                   CONCAT16(in_XMM1_Bm,
                                                                            CONCAT15(in_XMM1_Bl,
                                                                                     CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                 CONCAT17(in_XMM1_Bo,
                                                          CONCAT16(in_XMM1_Bn,
                                                                   CONCAT15(in_XMM1_Bm,
                                                                            CONCAT14(in_XMM1_Bl,
                                                                                     CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
      uVar3 = 0;
      if (uVar21 != 0) {
        for (; (uVar21 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      uVar22 = (ulong)uVar3;
      piVar23 = piVar23 + uVar22 * 2;
      cVar1 = pcVar25[uVar22];
      pcVar25 = pcVar25 + uVar22;
    }
    lVar2 = *(long *)((long)&local_330.sets_._M_elems[0].set_.capacity_ + lVar20);
    local_338 = lVar20;
    while (pcVar25 != pcVar24 + lVar2) {
      local_354 = local_354 + 1;
      iVar19 = *piVar23 + 6;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_350,"v.key + 6","v.value",(int *)&stack0xfffffffffffffc98,
                 piVar23 + 1);
      if ((char)local_350.key == '\0') {
        testing::Message::Message((Message *)&stack0xfffffffffffffc98);
        message = "";
        if (pbStack_348 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          message = (pbStack_348->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_360,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
                   ,0x70,message);
        testing::internal::AssertHelper::operator=(&local_360,(Message *)&stack0xfffffffffffffc98);
        testing::internal::AssertHelper::~AssertHelper(&local_360);
        if ((long *)CONCAT44(in_stack_fffffffffffffc9c,iVar19) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(in_stack_fffffffffffffc9c,iVar19) + 8))();
        }
      }
      if (pbStack_348 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_348,pbStack_348);
      }
      piVar23 = piVar23 + 2;
      cVar1 = pcVar25[1];
      pcVar25 = pcVar25 + 1;
      while (cVar1 < -1) {
        iVar19 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                        == CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                        );
        iVar8 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                       CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
        iVar9 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                       CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
        iVar10 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        == CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        );
        in_XMM1_Ba = -(*pcVar25 < (char)iVar19);
        in_XMM1_Bb = -(pcVar25[1] < (char)((uint)iVar19 >> 8));
        in_XMM1_Bc = -(pcVar25[2] < (char)((uint)iVar19 >> 0x10));
        in_XMM1_Bd = -(pcVar25[3] < (char)((uint)iVar19 >> 0x18));
        in_XMM1_Be = -(pcVar25[4] < (char)iVar8);
        in_XMM1_Bf = -(pcVar25[5] < (char)((uint)iVar8 >> 8));
        in_XMM1_Bg = -(pcVar25[6] < (char)((uint)iVar8 >> 0x10));
        in_XMM1_Bh = -(pcVar25[7] < (char)((uint)iVar8 >> 0x18));
        in_XMM1_Bi = -(pcVar25[8] < (char)iVar9);
        in_XMM1_Bj = -(pcVar25[9] < (char)((uint)iVar9 >> 8));
        in_XMM1_Bk = -(pcVar25[10] < (char)((uint)iVar9 >> 0x10));
        in_XMM1_Bl = -(pcVar25[0xb] < (char)((uint)iVar9 >> 0x18));
        in_XMM1_Bm = -(pcVar25[0xc] < (char)iVar10);
        in_XMM1_Bn = -(pcVar25[0xd] < (char)((uint)iVar10 >> 8));
        in_XMM1_Bo = -(pcVar25[0xe] < (char)((uint)iVar10 >> 0x10));
        in_XMM1_Bp = -(pcVar25[0xf] < (char)((uint)iVar10 >> 0x18));
        auVar6[1] = in_XMM1_Bb;
        auVar6[0] = in_XMM1_Ba;
        auVar6[2] = in_XMM1_Bc;
        auVar6[3] = in_XMM1_Bd;
        auVar6[4] = in_XMM1_Be;
        auVar6[5] = in_XMM1_Bf;
        auVar6[6] = in_XMM1_Bg;
        auVar6[7] = in_XMM1_Bh;
        auVar6[8] = in_XMM1_Bi;
        auVar6[9] = in_XMM1_Bj;
        auVar6[10] = in_XMM1_Bk;
        auVar6[0xb] = in_XMM1_Bl;
        auVar6[0xc] = in_XMM1_Bm;
        auVar6[0xd] = in_XMM1_Bn;
        auVar6[0xe] = in_XMM1_Bo;
        auVar6[0xf] = in_XMM1_Bp;
        auVar7[1] = in_XMM1_Bb;
        auVar7[0] = in_XMM1_Ba;
        auVar7[2] = in_XMM1_Bc;
        auVar7[3] = in_XMM1_Bd;
        auVar7[4] = in_XMM1_Be;
        auVar7[5] = in_XMM1_Bf;
        auVar7[6] = in_XMM1_Bg;
        auVar7[7] = in_XMM1_Bh;
        auVar7[8] = in_XMM1_Bi;
        auVar7[9] = in_XMM1_Bj;
        auVar7[10] = in_XMM1_Bk;
        auVar7[0xb] = in_XMM1_Bl;
        auVar7[0xc] = in_XMM1_Bm;
        auVar7[0xd] = in_XMM1_Bn;
        auVar7[0xe] = in_XMM1_Bo;
        auVar7[0xf] = in_XMM1_Bp;
        auVar18[1] = in_XMM1_Bd;
        auVar18[0] = in_XMM1_Bc;
        auVar18[2] = in_XMM1_Be;
        auVar18[3] = in_XMM1_Bf;
        auVar18[4] = in_XMM1_Bg;
        auVar18[5] = in_XMM1_Bh;
        auVar18[6] = in_XMM1_Bi;
        auVar18[7] = in_XMM1_Bj;
        auVar18[8] = in_XMM1_Bk;
        auVar18[9] = in_XMM1_Bl;
        auVar18[10] = in_XMM1_Bm;
        auVar18[0xb] = in_XMM1_Bn;
        auVar18[0xc] = in_XMM1_Bo;
        auVar18[0xd] = in_XMM1_Bp;
        auVar16[1] = in_XMM1_Be;
        auVar16[0] = in_XMM1_Bd;
        auVar16[2] = in_XMM1_Bf;
        auVar16[3] = in_XMM1_Bg;
        auVar16[4] = in_XMM1_Bh;
        auVar16[5] = in_XMM1_Bi;
        auVar16[6] = in_XMM1_Bj;
        auVar16[7] = in_XMM1_Bk;
        auVar16[8] = in_XMM1_Bl;
        auVar16[9] = in_XMM1_Bm;
        auVar16[10] = in_XMM1_Bn;
        auVar16[0xb] = in_XMM1_Bo;
        auVar16[0xc] = in_XMM1_Bp;
        auVar14[1] = in_XMM1_Bf;
        auVar14[0] = in_XMM1_Be;
        auVar14[2] = in_XMM1_Bg;
        auVar14[3] = in_XMM1_Bh;
        auVar14[4] = in_XMM1_Bi;
        auVar14[5] = in_XMM1_Bj;
        auVar14[6] = in_XMM1_Bk;
        auVar14[7] = in_XMM1_Bl;
        auVar14[8] = in_XMM1_Bm;
        auVar14[9] = in_XMM1_Bn;
        auVar14[10] = in_XMM1_Bo;
        auVar14[0xb] = in_XMM1_Bp;
        auVar12[1] = in_XMM1_Bg;
        auVar12[0] = in_XMM1_Bf;
        auVar12[2] = in_XMM1_Bh;
        auVar12[3] = in_XMM1_Bi;
        auVar12[4] = in_XMM1_Bj;
        auVar12[5] = in_XMM1_Bk;
        auVar12[6] = in_XMM1_Bl;
        auVar12[7] = in_XMM1_Bm;
        auVar12[8] = in_XMM1_Bn;
        auVar12[9] = in_XMM1_Bo;
        auVar12[10] = in_XMM1_Bp;
        uVar21 = (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar18 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar16 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar14 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar12 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                   CONCAT18(in_XMM1_Bo,
                                                            CONCAT17(in_XMM1_Bn,
                                                                     CONCAT16(in_XMM1_Bm,
                                                                              CONCAT15(in_XMM1_Bl,
                                                                                       CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                   CONCAT17(in_XMM1_Bo,
                                                            CONCAT16(in_XMM1_Bn,
                                                                     CONCAT15(in_XMM1_Bm,
                                                                              CONCAT14(in_XMM1_Bl,
                                                                                       CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                         7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
        uVar3 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        uVar22 = (ulong)uVar3;
        piVar23 = piVar23 + uVar22 * 2;
        cVar1 = pcVar25[uVar22];
        pcVar25 = pcVar25 + uVar22;
      }
    }
    lVar20 = local_338 + 0x30;
  } while (lVar20 != 0x300);
  iVar19 = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_350,"counter","3",&local_354,(int *)&stack0xfffffffffffffc98);
  if ((char)local_350.key == '\0') {
    testing::Message::Message((Message *)&stack0xfffffffffffffc98);
    if (pbStack_348 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar24 = "";
    }
    else {
      pcVar24 = (pbStack_348->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
               ,0x72,pcVar24);
    testing::internal::AssertHelper::operator=(&local_360,(Message *)&stack0xfffffffffffffc98);
    testing::internal::AssertHelper::~AssertHelper(&local_360);
    if ((long *)CONCAT44(in_stack_fffffffffffffc9c,iVar19) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_fffffffffffffc9c,iVar19) + 8))();
    }
  }
  if (pbStack_348 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_348,pbStack_348);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  ::~parallel_hash_set(&local_330);
  return;
}

Assistant:

Entry(int k, int v=0) : key(k), value(v) {}